

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.h
# Opt level: O2

void __thiscall TaskSpec::TaskSpec(TaskSpec *this,TaskSpec *oth)

{
  this->id_ = oth->id_;
  std::__cxx11::string::string((string *)&this->conn_id_,(string *)&oth->conn_id_);
  std::__cxx11::string::string((string *)&this->request_str_,(string *)&oth->request_str_);
  this->epoch_ms_ = oth->epoch_ms_;
  (this->work_estimated_).super___atomic_base<unsigned_long>._M_i =
       (oth->work_estimated_).super___atomic_base<unsigned_long>._M_i;
  (this->work_done_).super___atomic_base<unsigned_long>._M_i =
       (oth->work_done_).super___atomic_base<unsigned_long>._M_i;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(&this->locks_,&oth->locks_);
  return;
}

Assistant:

TaskSpec(const TaskSpec &oth)
        : id_(oth.id_),
          conn_id_(oth.conn_id_),
          request_str_(oth.request_str_),
          epoch_ms_(oth.epoch_ms_),
          work_estimated_(oth.work_estimated_.load()),
          work_done_(oth.work_done_.load()),
          locks_(oth.locks_) {}